

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O2

bool __thiscall FString::IsInt(FString *this)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  byte *pbVar5;
  byte *pbVar6;
  
  pbVar5 = (byte *)this->Chars;
  do {
    pbVar6 = pbVar5;
    pbVar5 = pbVar6 + 1;
    bVar1 = *pbVar6;
    if (bVar1 == 0) {
      return false;
    }
    uVar4 = (uint)bVar1;
    iVar2 = isspace(uVar4);
  } while (iVar2 != 0);
  if ((uVar4 == 0x2b) || (uVar4 == 0x2d)) {
    bVar1 = *pbVar5;
    pbVar6 = pbVar5;
  }
  if (bVar1 == 0x30) {
    if ((pbVar6[1] & 0xf8) != 0x30) {
      if ((pbVar6[1] & 0xdf) == 0x58) {
        pbVar6 = pbVar6 + 2;
        bVar3 = false;
        while ((bVar1 = *pbVar6, (byte)(bVar1 - 0x30) < 10 ||
               ((bVar1 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) != 0)
                )))) {
          pbVar6 = pbVar6 + 1;
          bVar3 = true;
        }
        if (bVar3) goto LAB_005472b8;
      }
      return false;
    }
    pbVar6 = pbVar6 + 1;
    do {
      bVar1 = pbVar6[1];
      pbVar6 = pbVar6 + 1;
    } while ((bVar1 & 0xf8) == 0x30);
  }
  else {
    if (8 < (byte)(bVar1 - 0x31)) {
      return false;
    }
    do {
      bVar1 = pbVar6[1];
      pbVar6 = pbVar6 + 1;
    } while ((byte)(bVar1 - 0x30) < 10);
  }
LAB_005472b8:
  while( true ) {
    pbVar6 = pbVar6 + 1;
    if ((bVar1 == 0) || (iVar2 = isspace((uint)bVar1), iVar2 == 0)) break;
    bVar1 = *pbVar6;
  }
  return bVar1 == 0;
}

Assistant:

bool FString::IsInt () const
{
	// String must match: [whitespace] [{+ | �}] [0 [{ x | X }]] [digits] [whitespace]

/* This state machine is based on a simplification of re2c's output for this input:
digits		= [0-9];
hexdigits	= [0-9a-fA-F];
octdigits	= [0-7];

("0" octdigits+ | "0" [xX] hexdigits+ | (digits \ '0') digits*) { return true; }
[\000-\377] { return false; }*/
	const char *YYCURSOR = Chars;
	char yych;

	yych = *YYCURSOR;

	// Skip preceding whitespace
	while (yych != '\0' && isspace((unsigned char)yych)) { yych = *++YYCURSOR; }

	// Check for sign
	if (yych == '+' || yych == '-') { yych = *++YYCURSOR; }

	if (yych == '0')
	{
		yych = *++YYCURSOR;
		if (yych >= '0' && yych <= '7')
		{
			do { yych = *++YYCURSOR; } while (yych >= '0' && yych <= '7');
		}
		else if (yych == 'X' || yych == 'x')
		{
			bool gothex = false;
			yych = *++YYCURSOR;
			while ((yych >= '0' && yych <= '9') || (yych >= 'A' && yych <= 'F') || (yych >= 'a' && yych <= 'f'))
			{
				gothex = true;
				yych = *++YYCURSOR;
			}
			if (!gothex) return false;
		}
		else
		{
			return false;
		}
	}
	else if (yych >= '1' && yych <= '9')
	{
		do { yych = *++YYCURSOR; } while (yych >= '0' && yych <= '9');
	}
	else
	{
		return false;
	}

	// The rest should all be whitespace
	while (yych != '\0' && isspace((unsigned char)yych)) { yych = *++YYCURSOR; }
	return yych == '\0';
}